

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O3

bool __thiscall crnlib::dds_comp::compress_init(dds_comp *this,crn_comp_params *params)

{
  uint uVar1;
  crn_uint32 cVar2;
  uint uVar3;
  crn_dxt_quality cVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  pixel_format pVar8;
  int iVar9;
  uint uVar10;
  
  clear(this);
  this->m_pParams = params;
  uVar10 = params->m_width;
  uVar1 = params->m_height;
  uVar5 = uVar1;
  if (uVar10 >= uVar1 && uVar10 != uVar1) {
    uVar5 = uVar10;
  }
  if (uVar10 < uVar1) {
    uVar1 = uVar10;
  }
  if ((uVar1 != 0) && (uVar5 < 0x1001)) {
    uVar10 = params->m_levels;
    if (params->m_faces < params->m_levels) {
      uVar10 = params->m_faces;
    }
    if (uVar10 != 0) {
      bVar6 = create_dds_tex(this,&this->m_src_tex);
      if (bVar6) {
        dxt_image::pack_params::init(&this->m_pack_params,(EVP_PKEY_CTX *)this->m_pParams);
        if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
          (this->m_pack_params).m_pProgress_callback = progress_callback_func;
          (this->m_pack_params).m_pProgress_callback_user_data_ptr = params;
        }
        pVar8 = pixel_format_helpers::convert_crn_format_to_pixel_format(this->m_pParams->m_format);
        this->m_pixel_fmt = pVar8;
        if (pVar8 != PIXEL_FMT_INVALID) {
          if ((((pVar8 == PIXEL_FMT_DXT1) &&
               (bVar6 = mipmapped_texture::has_alpha(&this->m_src_tex), bVar6)) &&
              ((this->m_pack_params).m_use_both_block_types == true)) &&
             ((this->m_pParams->m_flags & 0x80) != 0)) {
            this->m_pixel_fmt = PIXEL_FMT_DXT1A;
          }
          iVar9 = task_pool::init(&this->m_task_pool,
                                  (EVP_PKEY_CTX *)(ulong)this->m_pParams->m_num_helper_threads);
          if ((char)iVar9 != '\0') {
            (this->m_pack_params).m_pTask_pool = &this->m_task_pool;
            cVar2 = params->m_quality_level;
            bVar7 = (bool)((byte)params->m_flags >> 1 & 1);
            uVar3 = (this->m_pack_params).m_dxt1a_alpha_threshold;
            cVar4 = (this->m_pack_params).m_quality;
            (this->m_q1_params).m_dxt_quality = cVar4;
            (this->m_q1_params).m_hierarchical = bVar7;
            (this->m_q1_params).m_perceptual = (this->m_pack_params).m_perceptual;
            bVar6 = (this->m_pack_params).m_use_both_block_types;
            (this->m_q1_params).m_use_alpha_blocks = bVar6;
            (this->m_q1_params).m_quality_level = cVar2;
            (this->m_q1_params).m_dxt1a_alpha_threshold = uVar3;
            (this->m_q5_params).m_dxt_quality = cVar4;
            (this->m_q5_params).m_hierarchical = bVar7;
            (this->m_q5_params).m_comp_index = 3;
            (this->m_q5_params).m_use_both_block_types = bVar6;
            (this->m_q5_params).m_quality_level = cVar2;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool dds_comp::compress_init(const crn_comp_params& params)
    {
        clear();

        m_pParams = &params;

        if ((math::minimum(m_pParams->m_width, m_pParams->m_height) < 1) || (math::maximum(m_pParams->m_width, m_pParams->m_height) > cCRNMaxLevelResolution))
        {
            return false;
        }

        if (math::minimum(m_pParams->m_faces, m_pParams->m_levels) < 1)
        {
            return false;
        }

        if (!create_dds_tex(m_src_tex))
        {
            return false;
        }

        m_pack_params.init(*m_pParams);
        if (params.m_pProgress_func)
        {
            m_pack_params.m_pProgress_callback = progress_callback_func;
            m_pack_params.m_pProgress_callback_user_data_ptr = (void*)&params;
        }

        m_pixel_fmt = pixel_format_helpers::convert_crn_format_to_pixel_format(static_cast<crn_format>(m_pParams->m_format));
        if (m_pixel_fmt == PIXEL_FMT_INVALID)
        {
            return false;
        }
        if ((m_pixel_fmt == PIXEL_FMT_DXT1) && (m_src_tex.has_alpha()) && (m_pack_params.m_use_both_block_types) && (m_pParams->m_flags & cCRNCompFlagDXT1AForTransparency))
        {
            m_pixel_fmt = PIXEL_FMT_DXT1A;
        }

        if (!m_task_pool.init(m_pParams->m_num_helper_threads))
        {
            return false;
        }
        m_pack_params.m_pTask_pool = &m_task_pool;

        const bool hierarchical = (params.m_flags & cCRNCompFlagHierarchical) != 0;
        m_q1_params.init(m_pack_params, params.m_quality_level, hierarchical);
        m_q5_params.init(m_pack_params, params.m_quality_level, hierarchical);

        return true;
    }